

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O0

Result __thiscall wabt::WastParser::ParseMemoryModuleField(WastParser *this,Module *module)

{
  bool bVar1;
  Result RVar2;
  pointer pMVar3;
  pointer pMVar4;
  pointer pDVar5;
  ExprList *this_00;
  reference pvVar6;
  ulong uVar7;
  size_type sVar8;
  unique_ptr<wabt::MemoryModuleField,_std::default_delete<wabt::MemoryModuleField>_> local_208;
  Enum local_1fc;
  unique_ptr<wabt::DataSegmentModuleField,_std::default_delete<wabt::DataSegmentModuleField>_>
  local_1f8;
  unique_ptr<wabt::MemoryModuleField,_std::default_delete<wabt::MemoryModuleField>_> local_1f0;
  uint local_1e4;
  uint local_1e0;
  uint32_t page_size;
  uint32_t byte_size;
  Const local_1b8;
  unique_ptr<wabt::ConstExpr,_std::default_delete<wabt::ConstExpr>_> local_170;
  unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> local_168;
  Location local_160;
  Var local_140;
  DataSegment *local_f8;
  DataSegment *data_segment;
  unique_ptr<wabt::DataSegmentModuleField,_std::default_delete<wabt::DataSegmentModuleField>_>
  data_segment_field;
  unique_ptr<wabt::MemoryModuleField,_std::default_delete<wabt::MemoryModuleField>_> local_e0;
  unique_ptr<wabt::MemoryModuleField,_std::default_delete<wabt::MemoryModuleField>_> field_1;
  Location local_d0;
  unique_ptr<wabt::ImportModuleField,_std::default_delete<wabt::ImportModuleField>_> local_b0;
  unique_ptr<wabt::ImportModuleField,_std::default_delete<wabt::ImportModuleField>_> field;
  unique_ptr<wabt::MemoryImport,_std::default_delete<wabt::MemoryImport>_> local_98;
  unique_ptr<wabt::MemoryImport,_std::default_delete<wabt::MemoryImport>_> import;
  undefined1 local_88 [8];
  ModuleFieldList export_fields;
  string name;
  undefined1 local_48 [8];
  Location loc;
  Module *module_local;
  WastParser *this_local;
  
  loc.field_1._12_4_ = Expect(this,Lpar);
  bVar1 = Failed((Result)loc.field_1._12_4_);
  if (bVar1) {
    Result::Result((Result *)((long)&this_local + 4),Error);
    return (Result)this_local._4_4_;
  }
  GetLocation((Location *)local_48,this);
  RVar2 = Expect(this,Memory);
  bVar1 = Failed(RVar2);
  if (bVar1) {
    Result::Result((Result *)((long)&this_local + 4),Error);
    return (Result)this_local._4_4_;
  }
  std::__cxx11::string::string((string *)&export_fields.size_);
  ParseBindVarOpt(this,(string *)&export_fields.size_);
  intrusive_list<wabt::ModuleField>::intrusive_list((intrusive_list<wabt::ModuleField> *)local_88);
  import._M_t.super___uniq_ptr_impl<wabt::MemoryImport,_std::default_delete<wabt::MemoryImport>_>.
  _M_t.super__Tuple_impl<0UL,_wabt::MemoryImport_*,_std::default_delete<wabt::MemoryImport>_>.
  super__Head_base<0UL,_wabt::MemoryImport_*,_false>._M_head_impl._4_4_ =
       ParseInlineExports(this,(ModuleFieldList *)local_88,Memory);
  bVar1 = Failed(import._M_t.
                 super___uniq_ptr_impl<wabt::MemoryImport,_std::default_delete<wabt::MemoryImport>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_wabt::MemoryImport_*,_std::default_delete<wabt::MemoryImport>_>
                 .super__Head_base<0UL,_wabt::MemoryImport_*,_false>._M_head_impl._4_4_);
  if (bVar1) {
    Result::Result((Result *)((long)&this_local + 4),Error);
    import._M_t.super___uniq_ptr_impl<wabt::MemoryImport,_std::default_delete<wabt::MemoryImport>_>.
    _M_t.super__Tuple_impl<0UL,_wabt::MemoryImport_*,_std::default_delete<wabt::MemoryImport>_>.
    super__Head_base<0UL,_wabt::MemoryImport_*,_false>._M_head_impl._0_4_ = 1;
    goto LAB_002b6048;
  }
  bVar1 = PeekMatchLpar(this,Import);
  if (bVar1) {
    CheckImportOrdering(this,module);
    MakeUnique<wabt::MemoryImport,std::__cxx11::string&>
              ((wabt *)&local_98,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               &export_fields.size_);
    pMVar3 = std::unique_ptr<wabt::MemoryImport,_std::default_delete<wabt::MemoryImport>_>::get
                       (&local_98);
    RVar2 = ParseInlineImport(this,(Import *)pMVar3);
    bVar1 = Failed(RVar2);
    if (bVar1) {
      Result::Result((Result *)((long)&this_local + 4),Error);
      import._M_t.
      super___uniq_ptr_impl<wabt::MemoryImport,_std::default_delete<wabt::MemoryImport>_>._M_t.
      super__Tuple_impl<0UL,_wabt::MemoryImport_*,_std::default_delete<wabt::MemoryImport>_>.
      super__Head_base<0UL,_wabt::MemoryImport_*,_false>._M_head_impl._0_4_ = 1;
    }
    else {
      pMVar3 = std::unique_ptr<wabt::MemoryImport,_std::default_delete<wabt::MemoryImport>_>::
               operator->(&local_98);
      RVar2 = ParseLimitsIndex(this,&(pMVar3->memory).page_limits);
      bVar1 = Failed(RVar2);
      if (bVar1) {
        Result::Result((Result *)((long)&this_local + 4),Error);
        import._M_t.
        super___uniq_ptr_impl<wabt::MemoryImport,_std::default_delete<wabt::MemoryImport>_>._M_t.
        super__Tuple_impl<0UL,_wabt::MemoryImport_*,_std::default_delete<wabt::MemoryImport>_>.
        super__Head_base<0UL,_wabt::MemoryImport_*,_false>._M_head_impl._0_4_ = 1;
      }
      else {
        pMVar3 = std::unique_ptr<wabt::MemoryImport,_std::default_delete<wabt::MemoryImport>_>::
                 operator->(&local_98);
        field._M_t.
        super___uniq_ptr_impl<wabt::ImportModuleField,_std::default_delete<wabt::ImportModuleField>_>
        ._M_t.
        super__Tuple_impl<0UL,_wabt::ImportModuleField_*,_std::default_delete<wabt::ImportModuleField>_>
        .super__Head_base<0UL,_wabt::ImportModuleField_*,_false>._M_head_impl._4_4_ =
             ParseLimits(this,&(pMVar3->memory).page_limits);
        bVar1 = Failed(field._M_t.
                       super___uniq_ptr_impl<wabt::ImportModuleField,_std::default_delete<wabt::ImportModuleField>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_wabt::ImportModuleField_*,_std::default_delete<wabt::ImportModuleField>_>
                       .super__Head_base<0UL,_wabt::ImportModuleField_*,_false>._M_head_impl._4_4_);
        if (bVar1) {
          Result::Result((Result *)((long)&this_local + 4),Error);
          import._M_t.
          super___uniq_ptr_impl<wabt::MemoryImport,_std::default_delete<wabt::MemoryImport>_>._M_t.
          super__Tuple_impl<0UL,_wabt::MemoryImport_*,_std::default_delete<wabt::MemoryImport>_>.
          super__Head_base<0UL,_wabt::MemoryImport_*,_false>._M_head_impl._0_4_ = 1;
        }
        else {
          GetLocation(&local_d0,this);
          MakeUnique<wabt::ImportModuleField,std::unique_ptr<wabt::MemoryImport,std::default_delete<wabt::MemoryImport>>,wabt::Location>
                    ((wabt *)&local_b0,&local_98,&local_d0);
          std::unique_ptr<wabt::ImportModuleField,_std::default_delete<wabt::ImportModuleField>_>::
          unique_ptr((unique_ptr<wabt::ImportModuleField,_std::default_delete<wabt::ImportModuleField>_>
                      *)&field_1,&local_b0);
          Module::AppendField(module,(unique_ptr<wabt::ImportModuleField,_std::default_delete<wabt::ImportModuleField>_>
                                      *)&field_1);
          std::unique_ptr<wabt::ImportModuleField,_std::default_delete<wabt::ImportModuleField>_>::
          ~unique_ptr((unique_ptr<wabt::ImportModuleField,_std::default_delete<wabt::ImportModuleField>_>
                       *)&field_1);
          std::unique_ptr<wabt::ImportModuleField,_std::default_delete<wabt::ImportModuleField>_>::
          ~unique_ptr(&local_b0);
          import._M_t.
          super___uniq_ptr_impl<wabt::MemoryImport,_std::default_delete<wabt::MemoryImport>_>._M_t.
          super__Tuple_impl<0UL,_wabt::MemoryImport_*,_std::default_delete<wabt::MemoryImport>_>.
          super__Head_base<0UL,_wabt::MemoryImport_*,_false>._M_head_impl._0_4_ = 0;
        }
      }
    }
    std::unique_ptr<wabt::MemoryImport,_std::default_delete<wabt::MemoryImport>_>::~unique_ptr
              (&local_98);
  }
  else {
    MakeUnique<wabt::MemoryModuleField,wabt::Location&,std::__cxx11::string&>
              ((wabt *)&local_e0,(Location *)local_48,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               &export_fields.size_);
    pMVar4 = std::unique_ptr<wabt::MemoryModuleField,_std::default_delete<wabt::MemoryModuleField>_>
             ::operator->(&local_e0);
    data_segment_field._M_t.
    super___uniq_ptr_impl<wabt::DataSegmentModuleField,_std::default_delete<wabt::DataSegmentModuleField>_>
    ._M_t.
    super__Tuple_impl<0UL,_wabt::DataSegmentModuleField_*,_std::default_delete<wabt::DataSegmentModuleField>_>
    .super__Head_base<0UL,_wabt::DataSegmentModuleField_*,_false>._M_head_impl._4_4_ =
         ParseLimitsIndex(this,&(pMVar4->memory).page_limits);
    bVar1 = Failed(data_segment_field._M_t.
                   super___uniq_ptr_impl<wabt::DataSegmentModuleField,_std::default_delete<wabt::DataSegmentModuleField>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_wabt::DataSegmentModuleField_*,_std::default_delete<wabt::DataSegmentModuleField>_>
                   .super__Head_base<0UL,_wabt::DataSegmentModuleField_*,_false>._M_head_impl._4_4_)
    ;
    if (bVar1) {
      Result::Result((Result *)((long)&this_local + 4),Error);
      import._M_t.
      super___uniq_ptr_impl<wabt::MemoryImport,_std::default_delete<wabt::MemoryImport>_>._M_t.
      super__Tuple_impl<0UL,_wabt::MemoryImport_*,_std::default_delete<wabt::MemoryImport>_>.
      super__Head_base<0UL,_wabt::MemoryImport_*,_false>._M_head_impl._0_4_ = 1;
    }
    else {
      bVar1 = MatchLpar(this,Data);
      if (bVar1) {
        MakeUnique<wabt::DataSegmentModuleField,wabt::Location&>
                  ((wabt *)&data_segment,(Location *)local_48);
        pDVar5 = std::
                 unique_ptr<wabt::DataSegmentModuleField,_std::default_delete<wabt::DataSegmentModuleField>_>
                 ::operator->((unique_ptr<wabt::DataSegmentModuleField,_std::default_delete<wabt::DataSegmentModuleField>_>
                               *)&data_segment);
        local_f8 = &pDVar5->data_segment;
        sVar8 = std::vector<wabt::Memory_*,_std::allocator<wabt::Memory_*>_>::size
                          (&module->memories);
        Location::Location(&local_160);
        Var::Var(&local_140,(Index)sVar8,&local_160);
        Var::operator=(&local_f8->memory_var,&local_140);
        Var::~Var(&local_140);
        this_00 = &local_f8->offset;
        Location::Location((Location *)&byte_size);
        Const::I32(&local_1b8,0,(Location *)&byte_size);
        MakeUnique<wabt::ConstExpr,wabt::Const>((wabt *)&local_170,&local_1b8);
        std::unique_ptr<wabt::Expr,std::default_delete<wabt::Expr>>::
        unique_ptr<wabt::ConstExpr,std::default_delete<wabt::ConstExpr>,void>
                  ((unique_ptr<wabt::Expr,std::default_delete<wabt::Expr>> *)&local_168,&local_170);
        intrusive_list<wabt::Expr>::push_back(this_00,&local_168);
        std::unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_>::~unique_ptr(&local_168);
        std::unique_ptr<wabt::ConstExpr,_std::default_delete<wabt::ConstExpr>_>::~unique_ptr
                  (&local_170);
        pvVar6 = intrusive_list<wabt::Expr>::back(&local_f8->offset);
        (pvVar6->loc).filename.data_ = (char *)local_48;
        (pvVar6->loc).filename.size_ = (size_type)loc.filename.data_;
        (pvVar6->loc).field_1.field_1.offset = loc.filename.size_;
        ((anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2 *)
        ((long)&(pvVar6->loc).field_1 + 8))->offset = (size_t)loc.field_1.field_1.offset;
        ParseTextListOpt(this,&local_f8->data);
        page_size = (uint32_t)Expect(this,Rpar);
        bVar1 = Failed((Result)page_size);
        if (bVar1) {
          Result::Result((Result *)((long)&this_local + 4),Error);
        }
        else {
          sVar8 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(&local_f8->data);
          local_1e4 = (int)sVar8 + 0xffff;
          local_1e0 = local_1e4 & 0xffff0000;
          local_1e4 = local_1e4 >> 0x10;
          uVar7 = (ulong)local_1e4;
          pMVar4 = std::
                   unique_ptr<wabt::MemoryModuleField,_std::default_delete<wabt::MemoryModuleField>_>
                   ::operator->(&local_e0);
          (pMVar4->memory).page_limits.initial = uVar7;
          uVar7 = (ulong)local_1e4;
          pMVar4 = std::
                   unique_ptr<wabt::MemoryModuleField,_std::default_delete<wabt::MemoryModuleField>_>
                   ::operator->(&local_e0);
          (pMVar4->memory).page_limits.max = uVar7;
          pMVar4 = std::
                   unique_ptr<wabt::MemoryModuleField,_std::default_delete<wabt::MemoryModuleField>_>
                   ::operator->(&local_e0);
          (pMVar4->memory).page_limits.has_max = true;
          std::unique_ptr<wabt::MemoryModuleField,_std::default_delete<wabt::MemoryModuleField>_>::
          unique_ptr(&local_1f0,&local_e0);
          Module::AppendField(module,&local_1f0);
          std::unique_ptr<wabt::MemoryModuleField,_std::default_delete<wabt::MemoryModuleField>_>::
          ~unique_ptr(&local_1f0);
          std::
          unique_ptr<wabt::DataSegmentModuleField,_std::default_delete<wabt::DataSegmentModuleField>_>
          ::unique_ptr(&local_1f8,
                       (unique_ptr<wabt::DataSegmentModuleField,_std::default_delete<wabt::DataSegmentModuleField>_>
                        *)&data_segment);
          Module::AppendField(module,&local_1f8);
          std::
          unique_ptr<wabt::DataSegmentModuleField,_std::default_delete<wabt::DataSegmentModuleField>_>
          ::~unique_ptr(&local_1f8);
        }
        import._M_t.
        super___uniq_ptr_impl<wabt::MemoryImport,_std::default_delete<wabt::MemoryImport>_>._M_t.
        super__Tuple_impl<0UL,_wabt::MemoryImport_*,_std::default_delete<wabt::MemoryImport>_>.
        super__Head_base<0UL,_wabt::MemoryImport_*,_false>._M_head_impl._1_3_ = 0;
        import._M_t.
        super___uniq_ptr_impl<wabt::MemoryImport,_std::default_delete<wabt::MemoryImport>_>._M_t.
        super__Tuple_impl<0UL,_wabt::MemoryImport_*,_std::default_delete<wabt::MemoryImport>_>.
        super__Head_base<0UL,_wabt::MemoryImport_*,_false>._M_head_impl._0_1_ = bVar1;
        std::
        unique_ptr<wabt::DataSegmentModuleField,_std::default_delete<wabt::DataSegmentModuleField>_>
        ::~unique_ptr((unique_ptr<wabt::DataSegmentModuleField,_std::default_delete<wabt::DataSegmentModuleField>_>
                       *)&data_segment);
        if ((uint)import._M_t.
                  super___uniq_ptr_impl<wabt::MemoryImport,_std::default_delete<wabt::MemoryImport>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_wabt::MemoryImport_*,_std::default_delete<wabt::MemoryImport>_>
                  .super__Head_base<0UL,_wabt::MemoryImport_*,_false>._M_head_impl == 0)
        goto LAB_002b5f94;
      }
      else {
        pMVar4 = std::
                 unique_ptr<wabt::MemoryModuleField,_std::default_delete<wabt::MemoryModuleField>_>
                 ::operator->(&local_e0);
        local_1fc = (Enum)ParseLimits(this,&(pMVar4->memory).page_limits);
        bVar1 = Failed((Result)local_1fc);
        if (bVar1) {
          Result::Result((Result *)((long)&this_local + 4),Error);
          import._M_t.
          super___uniq_ptr_impl<wabt::MemoryImport,_std::default_delete<wabt::MemoryImport>_>._M_t.
          super__Tuple_impl<0UL,_wabt::MemoryImport_*,_std::default_delete<wabt::MemoryImport>_>.
          super__Head_base<0UL,_wabt::MemoryImport_*,_false>._M_head_impl._0_4_ = 1;
        }
        else {
          std::unique_ptr<wabt::MemoryModuleField,_std::default_delete<wabt::MemoryModuleField>_>::
          unique_ptr(&local_208,&local_e0);
          Module::AppendField(module,&local_208);
          std::unique_ptr<wabt::MemoryModuleField,_std::default_delete<wabt::MemoryModuleField>_>::
          ~unique_ptr(&local_208);
LAB_002b5f94:
          import._M_t.
          super___uniq_ptr_impl<wabt::MemoryImport,_std::default_delete<wabt::MemoryImport>_>._M_t.
          super__Tuple_impl<0UL,_wabt::MemoryImport_*,_std::default_delete<wabt::MemoryImport>_>.
          super__Head_base<0UL,_wabt::MemoryImport_*,_false>._M_head_impl._0_4_ = 0;
        }
      }
    }
    std::unique_ptr<wabt::MemoryModuleField,_std::default_delete<wabt::MemoryModuleField>_>::
    ~unique_ptr(&local_e0);
  }
  if ((uint)import._M_t.
            super___uniq_ptr_impl<wabt::MemoryImport,_std::default_delete<wabt::MemoryImport>_>._M_t
            .super__Tuple_impl<0UL,_wabt::MemoryImport_*,_std::default_delete<wabt::MemoryImport>_>.
            super__Head_base<0UL,_wabt::MemoryImport_*,_false>._M_head_impl == 0) {
    sVar8 = std::vector<wabt::Memory_*,_std::allocator<wabt::Memory_*>_>::size(&module->memories);
    anon_unknown_1::AppendInlineExportFields(module,(ModuleFieldList *)local_88,(int)sVar8 - 1);
    RVar2 = Expect(this,Rpar);
    bVar1 = Failed(RVar2);
    if (bVar1) {
      Result::Result((Result *)((long)&this_local + 4),Error);
      import._M_t.
      super___uniq_ptr_impl<wabt::MemoryImport,_std::default_delete<wabt::MemoryImport>_>._M_t.
      super__Tuple_impl<0UL,_wabt::MemoryImport_*,_std::default_delete<wabt::MemoryImport>_>.
      super__Head_base<0UL,_wabt::MemoryImport_*,_false>._M_head_impl._0_4_ = 1;
    }
    else {
      Result::Result((Result *)((long)&this_local + 4),Ok);
      import._M_t.
      super___uniq_ptr_impl<wabt::MemoryImport,_std::default_delete<wabt::MemoryImport>_>._M_t.
      super__Tuple_impl<0UL,_wabt::MemoryImport_*,_std::default_delete<wabt::MemoryImport>_>.
      super__Head_base<0UL,_wabt::MemoryImport_*,_false>._M_head_impl._0_4_ = 1;
    }
  }
LAB_002b6048:
  intrusive_list<wabt::ModuleField>::~intrusive_list((intrusive_list<wabt::ModuleField> *)local_88);
  std::__cxx11::string::~string((string *)&export_fields.size_);
  return (Result)this_local._4_4_;
}

Assistant:

Result WastParser::ParseMemoryModuleField(Module* module) {
  WABT_TRACE(ParseMemoryModuleField);
  EXPECT(Lpar);
  Location loc = GetLocation();
  EXPECT(Memory);
  std::string name;
  ParseBindVarOpt(&name);

  ModuleFieldList export_fields;
  CHECK_RESULT(ParseInlineExports(&export_fields, ExternalKind::Memory));

  if (PeekMatchLpar(TokenType::Import)) {
    CheckImportOrdering(module);
    auto import = MakeUnique<MemoryImport>(name);
    CHECK_RESULT(ParseInlineImport(import.get()));
    CHECK_RESULT(ParseLimitsIndex(&import->memory.page_limits));
    CHECK_RESULT(ParseLimits(&import->memory.page_limits));
    auto field =
        MakeUnique<ImportModuleField>(std::move(import), GetLocation());
    module->AppendField(std::move(field));
  } else {
    auto field = MakeUnique<MemoryModuleField>(loc, name);
    CHECK_RESULT(ParseLimitsIndex(&field->memory.page_limits));
    if (MatchLpar(TokenType::Data)) {
      auto data_segment_field = MakeUnique<DataSegmentModuleField>(loc);
      DataSegment& data_segment = data_segment_field->data_segment;
      data_segment.memory_var = Var(module->memories.size());
      data_segment.offset.push_back(MakeUnique<ConstExpr>(Const::I32(0)));
      data_segment.offset.back().loc = loc;
      ParseTextListOpt(&data_segment.data);
      EXPECT(Rpar);

      uint32_t byte_size = WABT_ALIGN_UP_TO_PAGE(data_segment.data.size());
      uint32_t page_size = WABT_BYTES_TO_PAGES(byte_size);
      field->memory.page_limits.initial = page_size;
      field->memory.page_limits.max = page_size;
      field->memory.page_limits.has_max = true;

      module->AppendField(std::move(field));
      module->AppendField(std::move(data_segment_field));
    } else {
      CHECK_RESULT(ParseLimits(&field->memory.page_limits));
      module->AppendField(std::move(field));
    }
  }

  AppendInlineExportFields(module, &export_fields, module->memories.size() - 1);

  EXPECT(Rpar);
  return Result::Ok;
}